

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMaj.c
# Opt level: O0

void Gem_ManRealloc(Gem_Man_t *p)

{
  uint uVar1;
  Gem_Obj_t *local_20;
  int nObjNew;
  Gem_Man_t *p_local;
  
  uVar1 = Abc_MinInt(p->nObjsAlloc << 1,0x7fffffff);
  if (p->nObjs != p->nObjsAlloc) {
    __assert_fail("p->nObjs == p->nObjsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMaj.c"
                  ,0x75,"void Gem_ManRealloc(Gem_Man_t *)");
  }
  if (p->nObjs == 0x7fffffff) {
    printf("Hard limit on the number of nodes (0x7FFFFFFF) is reached. Quitting...\n");
    exit(1);
  }
  if (p->nObjs < (int)uVar1) {
    printf("Extending object storage: %d -> %d.\n",(ulong)(uint)p->nObjsAlloc,(ulong)uVar1);
    if (p->pObjs == (Gem_Obj_t *)0x0) {
      local_20 = (Gem_Obj_t *)malloc((long)(int)uVar1 << 3);
    }
    else {
      local_20 = (Gem_Obj_t *)realloc(p->pObjs,(long)(int)uVar1 << 3);
    }
    p->pObjs = local_20;
    memset(p->pObjs + p->nObjsAlloc,0,(long)(int)(uVar1 - p->nObjsAlloc) << 3);
    p->nObjsAlloc = uVar1;
    return;
  }
  __assert_fail("p->nObjs < nObjNew",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMaj.c"
                ,0x78,"void Gem_ManRealloc(Gem_Man_t *)");
}

Assistant:

void Gem_ManRealloc( Gem_Man_t * p )
{
    int nObjNew = Abc_MinInt( 2 * p->nObjsAlloc, 0x7FFFFFFF );
    assert( p->nObjs == p->nObjsAlloc );
    if ( p->nObjs == 0x7FFFFFFF )
        printf( "Hard limit on the number of nodes (0x7FFFFFFF) is reached. Quitting...\n" ), exit(1);
    assert( p->nObjs < nObjNew );
    printf("Extending object storage: %d -> %d.\n", p->nObjsAlloc, nObjNew );
    p->pObjs = ABC_REALLOC( Gem_Obj_t, p->pObjs, nObjNew );
    memset( p->pObjs + p->nObjsAlloc, 0, sizeof(Gem_Obj_t) * (nObjNew - p->nObjsAlloc) );
    p->nObjsAlloc = nObjNew;
}